

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O3

void divsufsortxx::substring::merge_forward<char*,bitmap::BitmapArray<long>::iterator,long*>
               (char *T,iterator PA,long *buf,iterator first,iterator middle,iterator last,
               value_type depth)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  int extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  int extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  long lVar4;
  BitmapArray<long> *pBVar5;
  pos_type pVar6;
  pos_type pVar7;
  long *plVar8;
  long *plVar9;
  iterator p1;
  iterator p2;
  ulong local_70;
  
  pVar7 = first.pos_;
  pBVar5 = first.array_;
  p1.array_ = PA.array_;
  pVar6 = pVar7;
  plVar8 = buf;
  if (middle.pos_ - pVar7 != 0) {
    do {
      lVar4 = *plVar8;
      (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,pVar6);
      (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,pVar6,lVar4);
      pVar6 = pVar6 + 1;
      plVar8 = plVar8 + 1;
    } while (middle.pos_ != pVar6);
  }
  local_70 = middle.pos_;
  plVar8 = buf + (middle.pos_ - pVar7);
  iVar2 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,pVar7);
  do {
    while( true ) {
      lVar4 = *buf;
      iVar3 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,local_70);
      p1.pos_ = lVar4 + PA.pos_;
      p2.pos_ = CONCAT44(extraout_var_00,iVar3) + PA.pos_;
      p2.array_ = p1.array_;
      iVar3 = compare<char*,bitmap::BitmapArray<long>::iterator>(T,p1,p2,depth);
      if (iVar3 < 0) break;
      pVar6 = pVar7;
      if (iVar3 == 0) {
        iVar3 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,local_70);
        (*((middle.array_)->super_Bitmap)._vptr_Bitmap[4])
                  (middle.array_,local_70,~CONCAT44(extraout_var_05,iVar3));
        lVar4 = *buf;
        plVar9 = buf;
        do {
          buf = plVar9 + 1;
          pVar6 = pVar7 + 1;
          (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,pVar7,lVar4);
          iVar3 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,pVar6);
          *plVar9 = CONCAT44(extraout_var_06,iVar3);
          if (plVar8 <= buf) goto LAB_0010bb05;
          lVar4 = *buf;
          pVar7 = pVar6;
          plVar9 = buf;
        } while (lVar4 < 0);
        do {
          pVar7 = pVar6 + 1;
          iVar3 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,local_70);
          (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,pVar6,CONCAT44(extraout_var_07,iVar3));
          uVar1 = local_70 + 1;
          iVar3 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,pVar7);
          (*((middle.array_)->super_Bitmap)._vptr_Bitmap[4])
                    (middle.array_,local_70,CONCAT44(extraout_var_08,iVar3));
          if (last.pos_ <= uVar1) goto LAB_0010bad5;
          (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar1);
          local_70 = uVar1;
          pVar6 = pVar7;
        } while (extraout_var_09 < 0);
      }
      else {
        do {
          pVar7 = pVar6 + 1;
          iVar3 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,local_70);
          (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,pVar6,CONCAT44(extraout_var_01,iVar3));
          uVar1 = local_70 + 1;
          iVar3 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,pVar7);
          (*((middle.array_)->super_Bitmap)._vptr_Bitmap[4])
                    (middle.array_,local_70,CONCAT44(extraout_var_02,iVar3));
          if (last.pos_ <= uVar1) goto LAB_0010ba9c;
          (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar1);
          local_70 = uVar1;
          pVar6 = pVar7;
        } while (extraout_var_03 < 0);
      }
    }
    lVar4 = *buf;
    pVar6 = pVar7;
    plVar9 = buf;
    do {
      buf = plVar9 + 1;
      pVar7 = pVar6 + 1;
      (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,pVar6,lVar4);
      iVar3 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,pVar7);
      *plVar9 = CONCAT44(extraout_var_04,iVar3);
      if (plVar8 <= buf) goto LAB_0010bb05;
      lVar4 = *buf;
      pVar6 = pVar7;
      plVar9 = buf;
    } while (lVar4 < 0);
  } while( true );
LAB_0010ba9c:
  do {
    (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,pVar7,*buf);
    iVar3 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,pVar7 + 1);
    *buf = CONCAT44(extraout_var_10,iVar3);
    buf = buf + 1;
    pVar7 = pVar7 + 1;
  } while (buf < plVar8);
  goto LAB_0010bb05;
LAB_0010bad5:
  do {
    (*(pBVar5->super_Bitmap)._vptr_Bitmap[4])(pBVar5,pVar7,*buf);
    iVar3 = (*(pBVar5->super_Bitmap)._vptr_Bitmap[5])(pBVar5,pVar7 + 1);
    *buf = CONCAT44(extraout_var_11,iVar3);
    buf = buf + 1;
    pVar7 = pVar7 + 1;
  } while (buf < plVar8);
LAB_0010bb05:
  plVar8[-1] = CONCAT44(extraout_var,iVar2);
  return;
}

Assistant:

void merge_forward(
    const StringIterator_type T, const SAIterator_type PA, BufIterator_type buf,
    SAIterator_type first, SAIterator_type middle, SAIterator_type last,
    typename std::iterator_traits<SAIterator_type>::value_type depth) {
  SAIterator_type i, k;
  BufIterator_type j, bufend;
  typename std::iterator_traits<SAIterator_type>::value_type t;
  int r;

  bufend = buf + (middle - first);
  helper::vecswap(first, middle, buf);

  for (t = *first, i = first, j = buf, k = middle;;) {
    r = compare(T, PA + *j, PA + *k, depth);
    if (r < 0) {
      do {
        *i++ = *j;
        *j++ = *i;
        if (bufend <= j) {
          *(bufend - 1) = t;
          return;
        }
      } while (*j < 0);
    } else if (r > 0) {
      do {
        *i++ = *k;
        *k++ = *i;
        if (last <= k) {
          do {
            *i++ = *j;
            *j++ = *i;
          } while (j < bufend);
          *(bufend - 1) = t;
          return;
        }
      } while (*k < 0);
    } else {
      *k = ~*k;
      do {
        *i++ = *j;
        *j++ = *i;
        if (bufend <= j) {
          *(bufend - 1) = t;
          return;
        }
      } while (*j < 0);

      do {
        *i++ = *k;
        *k++ = *i;
        if (last <= k) {
          do {
            *i++ = *j;
            *j++ = *i;
          } while (j < bufend);
          *(bufend - 1) = t;
          return;
        }
      } while (*k < 0);
    }
  }
}